

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::Parser::~Parser(Parser *this)

{
  Parser *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->struct_stack_);
  std::
  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ::~vector(&this->field_stack_);
  std::__cxx11::string::~string((string *)&this->doc_comment_);
  std::__cxx11::string::~string((string *)&this->attribute_);
  FlatBufferBuilder::~FlatBufferBuilder(&this->builder_);
  std::__cxx11::string::~string((string *)&this->error_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->name_space_);
  SymbolTable<flatbuffers::EnumDef>::~SymbolTable(&this->enums_);
  SymbolTable<flatbuffers::StructDef>::~SymbolTable(&this->structs_);
  return;
}

Assistant:

Parser() :
    root_struct_def(nullptr),
    source_(nullptr),
    cursor_(nullptr),
    line_(1) {}